

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

bool __thiscall absl::lts_20250127::Cord::EndsWith(Cord *this,Cord *rhs)

{
  bool bVar1;
  size_t sVar2;
  size_t size_to_compare;
  Cord tmp;
  Cord CStack_38;
  
  sVar2 = InlineRep::size(&this->contents_);
  size_to_compare = InlineRep::size(&rhs->contents_);
  if (sVar2 < size_to_compare) {
    bVar1 = false;
  }
  else {
    InlineRep::InlineRep(&CStack_38.contents_,&this->contents_);
    RemovePrefix(&CStack_38,sVar2 - size_to_compare);
    bVar1 = GenericCompare<bool,absl::lts_20250127::Cord>(&CStack_38,rhs,size_to_compare);
    ~Cord(&CStack_38);
  }
  return bVar1;
}

Assistant:

bool Cord::EndsWith(const Cord& rhs) const {
  size_t my_size = size();
  size_t rhs_size = rhs.size();

  if (my_size < rhs_size) return false;

  Cord tmp(*this);
  tmp.RemovePrefix(my_size - rhs_size);
  return tmp.EqualsImpl(rhs, rhs_size);
}